

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moveGeneration.cpp
# Opt level: O3

int bitScan(U64 board)

{
  long lVar1;
  
  lVar1 = 0;
  if (board != 0) {
    for (; (board >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  return (uint)lVar1 ^ 0x3f;
}

Assistant:

int bitScan(U64 board) {
  #if defined(__GNUC__) || defined(__GNUG__)
    return 63 - __builtin_ctzll(board);
  #else
  U64 LS1B = board & -board;
  int returner = 0;
  while(LS1B) {
    returner++;
    LS1B >>= 1;
  }
  return 64-returner;
  #endif
}